

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gnns_index.h
# Opt level: O3

void __thiscall
gnns::Gnns_Index<L2Distance<float>_>::build_index
          (Gnns_Index<L2Distance<float>_> *this,string *graph_index_path,string *graph_dist_path,
          bool rebuild)

{
  undefined7 in_register_00000009;
  
  if ((int)CONCAT71(in_register_00000009,rebuild) != 0) {
    Knn_Graph<L2Distance<float>_>::build_graph
              (&this->graph,&this->points,this->vec_len,this->k,this->method);
    Knn_Graph<L2Distance<float>_>::save_graph(&this->graph,graph_index_path,graph_dist_path);
    return;
  }
  Knn_Graph<L2Distance<float>_>::load_graph(&this->graph,graph_index_path,graph_dist_path);
  return;
}

Assistant:

void build_index(const std::string& graph_index_path, const std::string& graph_dist_path, bool rebuild=false)
        {
            if(rebuild)
            {
                graph.build_graph(points, vec_len, k, method);
                graph.save_graph(graph_index_path, graph_dist_path);
            }
            else
            {
                try{
                    graph.load_graph(graph_index_path, graph_dist_path);
                }catch(std::exception& e){
                    std::cout << "The saved graph is not exist and building a graph, this may cost lots of time..." << std::endl;
                    graph.build_graph(points, vec_len, k, method);
                    graph.save_graph(graph_index_path, graph_dist_path);
                }
            }
        }